

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cc
# Opt level: O3

void __thiscall t_server::~t_server(t_server *this)

{
  pointer pptVar1;
  t_client *a_client;
  pointer pptVar2;
  
  pptVar2 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pptVar1 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (pptVar2 == pptVar1) {
        if (pptVar2 != (pointer)0x0) {
          operator_delete(pptVar2,(long)(this->v_clients).
                                        super__Vector_base<t_client_*,_std::allocator<t_client_*>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pptVar2);
          return;
        }
        return;
      }
      a_client = pptVar1[-1];
    } while (a_client->v_server == (t_server *)0x0);
    f_remove(a_client->v_server,a_client);
    a_client->v_server = (t_server *)0x0;
    pptVar2 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

t_server::~t_server()
{
	while (!v_clients.empty()) v_clients.back()->f_remove();
}